

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkyd(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  int iVar1;
  char *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  int *in_R8;
  char *in_XMM0_Qa;
  char card [81];
  char oldcomm [73];
  char valstring [71];
  int *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  double in_stack_fffffffffffffee8;
  int *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  fitsfile *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    iVar1 = ffgkey(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 < 1) {
      ffd2e(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
            in_stack_fffffffffffffed0);
      if ((in_RCX == (char *)0x0) || (*in_RCX == '&')) {
        ffmkky(in_RSI,in_XMM0_Qa,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_RCX,in_R8);
      }
      else {
        ffmkky(in_RSI,in_XMM0_Qa,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_RCX,in_R8);
      }
      ffmkey(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_4 = *in_R8;
    }
    else {
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffmkyd(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffd2e(value, decim, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}